

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O1

bool __thiscall SocketServer::commonListen(SocketServer *this)

{
  bool bVar1;
  int iVar2;
  int __fd;
  bool bVar3;
  SharedPtr loop;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  Error local_34;
  EventLoop *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  __fd = (int)&local_58;
  iVar2 = ::listen(this->fd,0x80);
  if (iVar2 < 0) {
    commonListen(this);
    bVar3 = false;
  }
  else {
    EventLoop::eventLoop();
    bVar3 = true;
    if (local_30 != (EventLoop *)0x0) {
      iVar2 = this->fd;
      local_48 = (code *)0x0;
      pcStack_40 = (code *)0x0;
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_58._M_unused._M_object = operator_new(0x18);
      *(code **)local_58._M_unused._0_8_ = socketCallback;
      (((SocketServer *)local_58._M_unused._0_8_)->path).super_String.mString._M_dataplus._M_p =
           (pointer)0x0;
      (((SocketServer *)local_58._M_unused._0_8_)->path).super_String.mString._M_string_length =
           (size_type)this;
      pcStack_40 = std::
                   _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketServer::*(SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                   ::_M_invoke;
      local_48 = std::
                 _Function_handler<void_(int,_unsigned_int),_std::_Bind<void_(SocketServer::*(SocketServer_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(int,_int)>_>
                 ::_M_manager;
      EventLoop::registerSocket(local_30,iVar2,1,(function<void_(int,_unsigned_int)> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      bVar1 = SocketClient::setFlags(this->fd,0x800,3,4,FlagAppend);
      if (!bVar1) {
        local_34 = InitializeError;
        local_58._M_unused._M_object = this;
        Signal<std::function<void(SocketServer*,SocketServer::Error)>>::operator()
                  (&this->serverError,(SocketServer **)&local_58,&local_34);
        close(this,__fd);
        bVar3 = false;
      }
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
  }
  return bVar3;
}

Assistant:

bool SocketServer::commonListen()
{
    // ### should be able to customize the backlog
    enum { Backlog = 128 };
    if (::listen(fd, Backlog) < 0) {
        fprintf(stderr, "::listen() failed with errno: %s\n",
                Rct::strerror().constData());

        serverError(this, ListenError);
        close();
        return false;
    }

    if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
        loop->registerSocket(fd, EventLoop::SocketRead,
                             //|EventLoop::SocketWrite,
                             std::bind(&SocketServer::socketCallback,
                                       this,
                                       std::placeholders::_1,
                                       std::placeholders::_2));
#ifndef _WIN32
        if (!SocketClient::setFlags(fd, O_NONBLOCK, F_GETFL, F_SETFL)) {
            serverError(this, InitializeError);
            close();
            return false;
        }
#endif
    }

    return true;
}